

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# freud_triang_test.cpp
# Opt level: O0

void __thiscall freudenthal_triangulation::test_method(freudenthal_triangulation *this)

{
  allocator<double> *paVar1;
  double dVar2;
  int iVar3;
  initializer_list<double> __l;
  initializer_list<unsigned_long> __l_00;
  initializer_list<unsigned_long> __l_01;
  initializer_list<unsigned_long> __l_02;
  initializer_list<unsigned_long> __l_03;
  initializer_list<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> __l_04;
  initializer_list<int> __l_05;
  initializer_list<double> __l_06;
  initializer_list<unsigned_long> __l_07;
  initializer_list<unsigned_long> __l_08;
  initializer_list<unsigned_long> __l_09;
  initializer_list<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> __l_10;
  initializer_list<int> __l_11;
  initializer_list<double> __l_12;
  initializer_list<unsigned_long> __l_13;
  initializer_list<unsigned_long> __l_14;
  initializer_list<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> __l_15;
  initializer_list<int> __l_16;
  initializer_list<double> __l_17;
  initializer_list<unsigned_long> __l_18;
  initializer_list<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> __l_19;
  initializer_list<int> __l_20;
  initializer_list<double> __l_21;
  undefined8 uVar4;
  Index IVar5;
  long lVar6;
  bool bVar7;
  type_conflict tVar8;
  uint uVar9;
  Vertex *pVVar10;
  lazy_ostream *plVar11;
  OrderedSetPartition *pOVar12;
  MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *pMVar13;
  MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *pMVar14;
  double *pdVar15;
  Index IVar16;
  Scalar *pSVar17;
  reference pvVar18;
  double *pdVar19;
  reference pvVar20;
  CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *pCVar21;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_13d8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_1318;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_1268;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_11c8;
  basic_cstring<const_char> local_1150;
  basic_cstring<const_char> local_1140;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_1130;
  assertion_result local_1110;
  basic_cstring<const_char> local_10f8;
  basic_cstring<const_char> local_10e8;
  basic_cstring<const_char> local_10d8;
  basic_cstring<const_char> local_10c8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_10b8;
  assertion_result local_1098;
  basic_cstring<const_char> local_1080;
  basic_cstring<const_char> local_1070;
  VectorXd local_1060;
  Scalar local_1050;
  Scalar local_1048;
  Scalar local_1040;
  undefined1 local_1038 [8];
  Vector3d new_offset;
  Scalar local_1018;
  Scalar local_1010;
  Scalar local_1008;
  Scalar local_1000;
  Scalar local_ff8;
  Scalar local_ff0;
  Scalar local_fe8;
  Scalar local_fe0;
  CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_fd8;
  int local_fb8 [2];
  undefined1 local_fb0 [8];
  MatrixXd new_matrix;
  size_t i_3;
  Scalar local_f80;
  Scalar local_f78;
  double *local_f70;
  size_t i_2;
  vector<int,_std::allocator<int>_> v_1;
  Vertex_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  __end1_1;
  Vertex_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  __begin1_1;
  Vertex_range *__range1_1;
  Simplex_handle local_e78;
  long local_e48;
  size_t i_1;
  Matrix<double,3,1,0,3,1> local_e30 [8];
  Vector3d barycenter;
  double *local_e10;
  size_t i;
  vector<int,_std::allocator<int>_> v;
  Vertex_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  __end1;
  Vertex_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  __begin1;
  Vertex_range *__range1;
  Matrix<double,3,1,0,3,1> local_d18 [8];
  Vector3d barycenter_cart;
  Simplex_handle s;
  double local_cc8 [4];
  iterator local_ca8;
  size_type local_ca0;
  undefined1 local_c98 [8];
  Point point;
  basic_cstring<const_char> local_c70;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_c60;
  assertion_result local_c40;
  basic_cstring<const_char> local_c28;
  basic_cstring<const_char> local_c18;
  ConstantReturnType local_c08;
  undefined1 local_bf0 [8];
  MatrixXd default_offset;
  basic_cstring<const_char> local_bc8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_bb8;
  assertion_result local_b98;
  basic_cstring<const_char> local_b80;
  basic_cstring<const_char> local_b70;
  IdentityReturnType local_b60;
  undefined1 local_b48 [8];
  MatrixXd default_matrix;
  basic_cstring<const_char> local_b20;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_b10;
  assertion_result local_af0;
  basic_cstring<const_char> local_ad8;
  basic_cstring<const_char> local_ac8;
  basic_cstring<const_char> local_ab8;
  basic_cstring<const_char> local_aa8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_a98;
  allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> local_a73;
  undefined1 local_a72;
  allocator<unsigned_long> local_a71;
  unsigned_long local_a70;
  iterator local_a68;
  size_type local_a60;
  allocator<unsigned_long> local_a51;
  unsigned_long local_a50;
  iterator local_a48;
  size_type local_a40;
  allocator<unsigned_long> local_a31;
  unsigned_long local_a30;
  iterator local_a28;
  size_type local_a20;
  allocator<unsigned_long> local_a11;
  unsigned_long local_a10;
  iterator local_a08;
  size_type local_a00;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_9f8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_9f0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_9d8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_9c0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_9a8;
  undefined1 local_990 [40];
  assertion_result local_968;
  basic_cstring<const_char> local_950;
  basic_cstring<const_char> local_940;
  basic_cstring<const_char> local_930;
  basic_cstring<const_char> local_920;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_910;
  allocator<int> local_8ed;
  int local_8ec [3];
  iterator local_8e0;
  size_type local_8d8;
  vector<int,_std::allocator<int>_> local_8d0;
  assertion_result local_8b8;
  basic_cstring<const_char> local_8a0;
  basic_cstring<const_char> local_890;
  undefined1 local_880 [8];
  Simplex_handle s_4;
  double local_848 [3];
  iterator local_830;
  size_type local_828;
  undefined1 local_820 [8];
  Point point_4;
  basic_cstring<const_char> local_7f8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_7e8;
  allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> local_7c3;
  undefined1 local_7c2;
  allocator<unsigned_long> local_7c1;
  unsigned_long local_7c0;
  iterator local_7b8;
  size_type local_7b0;
  allocator<unsigned_long> local_7a1;
  unsigned_long local_7a0;
  iterator local_798;
  size_type local_790;
  allocator<unsigned_long> local_781;
  unsigned_long local_780 [2];
  iterator local_770;
  size_type local_768;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_760;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_758;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_740;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_728;
  undefined1 local_710 [40];
  assertion_result local_6e8;
  basic_cstring<const_char> local_6d0;
  basic_cstring<const_char> local_6c0;
  basic_cstring<const_char> local_6b0;
  basic_cstring<const_char> local_6a0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_690;
  allocator<int> local_66d;
  int local_66c [3];
  iterator local_660;
  size_type local_658;
  vector<int,_std::allocator<int>_> local_650;
  assertion_result local_638;
  basic_cstring<const_char> local_620;
  basic_cstring<const_char> local_610;
  undefined1 local_600 [8];
  Simplex_handle s_3;
  double local_5c8 [4];
  iterator local_5a8;
  size_type local_5a0;
  undefined1 local_598 [8];
  Point point_3;
  basic_cstring<const_char> local_570;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_560;
  allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> local_53b;
  undefined1 local_53a;
  allocator<unsigned_long> local_539;
  unsigned_long local_538;
  iterator local_530;
  size_type local_528;
  allocator<unsigned_long> local_519;
  unsigned_long local_518 [4];
  iterator local_4f8;
  size_type local_4f0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_4e8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_4e0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_4c8;
  undefined1 local_4b0 [40];
  assertion_result local_488;
  basic_cstring<const_char> local_470;
  basic_cstring<const_char> local_460;
  basic_cstring<const_char> local_450;
  basic_cstring<const_char> local_440;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_430;
  allocator<int> local_40d;
  int local_40c [3];
  iterator local_400;
  size_type local_3f8;
  vector<int,_std::allocator<int>_> local_3f0;
  assertion_result local_3d8;
  basic_cstring<const_char> local_3c0;
  basic_cstring<const_char> local_3b0;
  undefined1 local_3a0 [8];
  Simplex_handle s_2;
  double local_368 [4];
  iterator local_348;
  size_type local_340;
  undefined1 local_338 [8];
  Point point_2;
  basic_cstring<const_char> local_310;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_300;
  allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> local_2db;
  undefined1 local_2da;
  allocator<unsigned_long> local_2d9;
  unsigned_long local_2d8 [5];
  iterator local_2b0;
  size_type local_2a8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_2a0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_298;
  undefined1 local_280 [40];
  assertion_result local_258;
  basic_cstring<const_char> local_240;
  basic_cstring<const_char> local_230;
  basic_cstring<const_char> local_220;
  basic_cstring<const_char> local_210;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_200;
  allocator<int> local_1dd;
  int local_1dc [3];
  iterator local_1d0;
  size_type local_1c8;
  vector<int,_std::allocator<int>_> local_1c0;
  assertion_result local_1a8;
  basic_cstring<const_char> local_190;
  basic_cstring<const_char> local_180;
  undefined1 local_170 [8];
  Simplex_handle s_1;
  allocator<double> local_129;
  double local_128 [3];
  iterator local_110;
  size_type local_108;
  undefined1 local_100 [8];
  Point point_1;
  FK_triangulation tr;
  freudenthal_triangulation *this_local;
  
  Gudhi::coxeter_triangulation::
  Freudenthal_triangulation<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  ::Freudenthal_triangulation
            ((Freudenthal_triangulation<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
              *)&point_1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage,3);
  local_128[0] = 3.0;
  local_128[1] = -1.0;
  local_128[2] = 0.0;
  local_110 = local_128;
  local_108 = 3;
  std::allocator<double>::allocator(&local_129);
  __l_21._M_len = local_108;
  __l_21._M_array = local_110;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_100,__l_21,&local_129);
  std::allocator<double>::~allocator(&local_129);
  Gudhi::coxeter_triangulation::
  Freudenthal_triangulation<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,std::allocator<int>>,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>>
  ::locate_point<std::vector<double,std::allocator<double>>>
            ((Simplex_handle *)local_170,
             &point_1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (vector<double,_std::allocator<double>_> *)local_100,1.0);
  do {
    uVar4 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_180,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Coxeter_triangulation/test/freud_triang_test.cpp"
               ,0x7a);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_190);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar4,&local_180,0x22,&local_190);
    pVVar10 = Gudhi::coxeter_triangulation::
              Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
              ::vertex((Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                        *)local_170);
    local_1dc[0] = 3;
    local_1dc[1] = 0xffffffff;
    local_1dc[2] = 0;
    local_1d0 = local_1dc;
    local_1c8 = 3;
    std::allocator<int>::allocator(&local_1dd);
    __l_20._M_len = local_1c8;
    __l_20._M_array = local_1d0;
    std::vector<int,_std::allocator<int>_>::vector(&local_1c0,__l_20,&local_1dd);
    bVar7 = std::operator==(pVVar10,&local_1c0);
    boost::test_tools::assertion_result::assertion_result(&local_1a8,bVar7);
    plVar11 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_210,"s.vertex() == Vertex_handle({3, -1, 0})",0x27);
    boost::unit_test::operator<<(&local_200,plVar11,&local_210);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_220,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Coxeter_triangulation/test/freud_triang_test.cpp"
               ,0x7a);
    boost::test_tools::tt_detail::report_assertion(&local_1a8,&local_200,&local_220,0x22,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_200);
    boost::test_tools::assertion_result::~assertion_result(&local_1a8);
    std::vector<int,_std::allocator<int>_>::~vector(&local_1c0);
    std::allocator<int>::~allocator(&local_1dd);
    bVar7 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar7);
  do {
    uVar4 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_230,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Coxeter_triangulation/test/freud_triang_test.cpp"
               ,0x7a);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_240);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar4,&local_230,0x23,&local_240);
    pOVar12 = Gudhi::coxeter_triangulation::
              Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
              ::partition((Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                           *)local_170);
    local_2da = 1;
    local_2d8[2] = 2;
    local_2d8[3] = 3;
    local_2d8[0] = 0;
    local_2d8[1] = 1;
    local_2b0 = local_2d8;
    local_2a8 = 4;
    local_2a0 = &local_298;
    std::allocator<unsigned_long>::allocator(&local_2d9);
    __l_18._M_len = local_2a8;
    __l_18._M_array = local_2b0;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_298,__l_18,&local_2d9)
    ;
    local_2da = 0;
    local_280._0_8_ = &local_298;
    local_280._8_8_ = (pointer)0x1;
    std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::allocator
              (&local_2db);
    __l_19._M_len = local_280._8_8_;
    __l_19._M_array = (iterator)local_280._0_8_;
    std::
    vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ::vector((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
              *)(local_280 + 0x10),__l_19,&local_2db);
    bVar7 = std::operator==(pOVar12,(vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                     *)(local_280 + 0x10));
    boost::test_tools::assertion_result::assertion_result(&local_258,bVar7);
    plVar11 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_310,"s.partition() == Ordered_set_partition({Part({0, 1, 2, 3})})",0x3c);
    boost::unit_test::operator<<(&local_300,plVar11,&local_310);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               &point_2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Coxeter_triangulation/test/freud_triang_test.cpp"
               ,0x7a);
    boost::test_tools::tt_detail::report_assertion
              (&local_258,&local_300,
               &point_2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,0x23,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_300);
    boost::test_tools::assertion_result::~assertion_result(&local_258);
    std::
    vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ::~vector((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
               *)(local_280 + 0x10));
    std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::~allocator
              (&local_2db);
    local_11c8 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_280;
    do {
      local_11c8 = local_11c8 + -1;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(local_11c8);
    } while (local_11c8 != &local_298);
    std::allocator<unsigned_long>::~allocator(&local_2d9);
    bVar7 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar7);
  Gudhi::coxeter_triangulation::
  Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  ::~Permutahedral_representation
            ((Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
              *)local_170);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_100);
  local_368[2] = 0.5;
  local_368[0] = 3.5;
  local_368[1] = -1.5;
  local_348 = local_368;
  local_340 = 3;
  paVar1 = (allocator<double> *)
           ((long)&s_2.partition_.
                   super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<double>::allocator(paVar1);
  __l_17._M_len = local_340;
  __l_17._M_array = local_348;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_338,__l_17,paVar1);
  std::allocator<double>::~allocator
            ((allocator<double> *)
             ((long)&s_2.partition_.
                     super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  Gudhi::coxeter_triangulation::
  Freudenthal_triangulation<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,std::allocator<int>>,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>>
  ::locate_point<std::vector<double,std::allocator<double>>>
            ((Simplex_handle *)local_3a0,
             &point_1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (vector<double,_std::allocator<double>_> *)local_338,1.0);
  do {
    uVar4 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_3b0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Coxeter_triangulation/test/freud_triang_test.cpp"
               ,0x7a);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_3c0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar4,&local_3b0,0x29,&local_3c0);
    pVVar10 = Gudhi::coxeter_triangulation::
              Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
              ::vertex((Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                        *)local_3a0);
    local_40c[0] = 3;
    local_40c[1] = 0xfffffffe;
    local_40c[2] = 0;
    local_400 = local_40c;
    local_3f8 = 3;
    std::allocator<int>::allocator(&local_40d);
    __l_16._M_len = local_3f8;
    __l_16._M_array = local_400;
    std::vector<int,_std::allocator<int>_>::vector(&local_3f0,__l_16,&local_40d);
    bVar7 = std::operator==(pVVar10,&local_3f0);
    boost::test_tools::assertion_result::assertion_result(&local_3d8,bVar7);
    plVar11 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_440,"s.vertex() == Vertex_handle({3, -2, 0})",0x27);
    boost::unit_test::operator<<(&local_430,plVar11,&local_440);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_450,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Coxeter_triangulation/test/freud_triang_test.cpp"
               ,0x7a);
    boost::test_tools::tt_detail::report_assertion(&local_3d8,&local_430,&local_450,0x29,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_430);
    boost::test_tools::assertion_result::~assertion_result(&local_3d8);
    std::vector<int,_std::allocator<int>_>::~vector(&local_3f0);
    std::allocator<int>::~allocator(&local_40d);
    bVar7 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar7);
  do {
    uVar4 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_460,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Coxeter_triangulation/test/freud_triang_test.cpp"
               ,0x7a);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_470);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar4,&local_460,0x2a,&local_470);
    pOVar12 = Gudhi::coxeter_triangulation::
              Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
              ::partition((Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                           *)local_3a0);
    local_53a = 1;
    local_518[0] = 0;
    local_518[1] = 1;
    local_518[2] = 2;
    local_4f8 = local_518;
    local_4f0 = 3;
    local_4e8 = &local_4e0;
    std::allocator<unsigned_long>::allocator(&local_519);
    __l_14._M_len = local_4f0;
    __l_14._M_array = local_4f8;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_4e0,__l_14,&local_519)
    ;
    local_538 = 3;
    local_530 = &local_538;
    local_528 = 1;
    local_4e8 = &local_4c8;
    std::allocator<unsigned_long>::allocator(&local_539);
    __l_13._M_len = local_528;
    __l_13._M_array = local_530;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_4c8,__l_13,&local_539)
    ;
    local_53a = 0;
    local_4b0._0_8_ = &local_4e0;
    local_4b0._8_8_ = (pointer)0x2;
    std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::allocator
              (&local_53b);
    __l_15._M_len = local_4b0._8_8_;
    __l_15._M_array = (iterator)local_4b0._0_8_;
    std::
    vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ::vector((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
              *)(local_4b0 + 0x10),__l_15,&local_53b);
    bVar7 = std::operator==(pOVar12,(vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                     *)(local_4b0 + 0x10));
    boost::test_tools::assertion_result::assertion_result(&local_488,bVar7);
    plVar11 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_570,"s.partition() == Ordered_set_partition({Part({0, 1, 2}), Part({3})})",
               0x44);
    boost::unit_test::operator<<(&local_560,plVar11,&local_570);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               &point_3.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Coxeter_triangulation/test/freud_triang_test.cpp"
               ,0x7a);
    boost::test_tools::tt_detail::report_assertion
              (&local_488,&local_560,
               &point_3.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,0x2a,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_560);
    boost::test_tools::assertion_result::~assertion_result(&local_488);
    std::
    vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ::~vector((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
               *)(local_4b0 + 0x10));
    std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::~allocator
              (&local_53b);
    local_1268 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_4b0;
    do {
      local_1268 = local_1268 + -1;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(local_1268);
    } while (local_1268 != &local_4e0);
    std::allocator<unsigned_long>::~allocator(&local_539);
    std::allocator<unsigned_long>::~allocator(&local_519);
    bVar7 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar7);
  Gudhi::coxeter_triangulation::
  Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  ::~Permutahedral_representation
            ((Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
              *)local_3a0);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_338);
  local_5c8[2] = 0.5;
  local_5c8[0] = 3.5;
  local_5c8[1] = -1.8;
  local_5a8 = local_5c8;
  local_5a0 = 3;
  paVar1 = (allocator<double> *)
           ((long)&s_3.partition_.
                   super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<double>::allocator(paVar1);
  __l_12._M_len = local_5a0;
  __l_12._M_array = local_5a8;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_598,__l_12,paVar1);
  std::allocator<double>::~allocator
            ((allocator<double> *)
             ((long)&s_3.partition_.
                     super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  Gudhi::coxeter_triangulation::
  Freudenthal_triangulation<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,std::allocator<int>>,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>>
  ::locate_point<std::vector<double,std::allocator<double>>>
            ((Simplex_handle *)local_600,
             &point_1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (vector<double,_std::allocator<double>_> *)local_598,1.0);
  do {
    uVar4 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_610,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Coxeter_triangulation/test/freud_triang_test.cpp"
               ,0x7a);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_620);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar4,&local_610,0x30,&local_620);
    pVVar10 = Gudhi::coxeter_triangulation::
              Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
              ::vertex((Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                        *)local_600);
    local_66c[0] = 3;
    local_66c[1] = 0xfffffffe;
    local_66c[2] = 0;
    local_660 = local_66c;
    local_658 = 3;
    std::allocator<int>::allocator(&local_66d);
    __l_11._M_len = local_658;
    __l_11._M_array = local_660;
    std::vector<int,_std::allocator<int>_>::vector(&local_650,__l_11,&local_66d);
    bVar7 = std::operator==(pVVar10,&local_650);
    boost::test_tools::assertion_result::assertion_result(&local_638,bVar7);
    plVar11 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_6a0,"s.vertex() == Vertex_handle({3, -2, 0})",0x27);
    boost::unit_test::operator<<(&local_690,plVar11,&local_6a0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_6b0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Coxeter_triangulation/test/freud_triang_test.cpp"
               ,0x7a);
    boost::test_tools::tt_detail::report_assertion(&local_638,&local_690,&local_6b0,0x30,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_690);
    boost::test_tools::assertion_result::~assertion_result(&local_638);
    std::vector<int,_std::allocator<int>_>::~vector(&local_650);
    std::allocator<int>::~allocator(&local_66d);
    bVar7 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar7);
  do {
    uVar4 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_6c0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Coxeter_triangulation/test/freud_triang_test.cpp"
               ,0x7a);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_6d0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar4,&local_6c0,0x31,&local_6d0);
    pOVar12 = Gudhi::coxeter_triangulation::
              Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
              ::partition((Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                           *)local_600);
    local_7c2 = 1;
    local_780[0] = 0;
    local_780[1] = 2;
    local_770 = local_780;
    local_768 = 2;
    local_760 = &local_758;
    std::allocator<unsigned_long>::allocator(&local_781);
    __l_09._M_len = local_768;
    __l_09._M_array = local_770;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_758,__l_09,&local_781)
    ;
    local_7a0 = 1;
    local_798 = &local_7a0;
    local_790 = 1;
    local_760 = &local_740;
    std::allocator<unsigned_long>::allocator(&local_7a1);
    __l_08._M_len = local_790;
    __l_08._M_array = local_798;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_740,__l_08,&local_7a1)
    ;
    local_7c0 = 3;
    local_7b8 = &local_7c0;
    local_7b0 = 1;
    local_760 = &local_728;
    std::allocator<unsigned_long>::allocator(&local_7c1);
    __l_07._M_len = local_7b0;
    __l_07._M_array = local_7b8;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_728,__l_07,&local_7c1)
    ;
    local_7c2 = 0;
    local_710._0_8_ = &local_758;
    local_710._8_8_ = (pointer)0x3;
    std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::allocator
              (&local_7c3);
    __l_10._M_len = local_710._8_8_;
    __l_10._M_array = (iterator)local_710._0_8_;
    std::
    vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ::vector((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
              *)(local_710 + 0x10),__l_10,&local_7c3);
    bVar7 = std::operator==(pOVar12,(vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                     *)(local_710 + 0x10));
    boost::test_tools::assertion_result::assertion_result(&local_6e8,bVar7);
    plVar11 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_7f8,
               "s.partition() == Ordered_set_partition({Part({0, 2}), Part({1}), Part({3})})",0x4c);
    boost::unit_test::operator<<(&local_7e8,plVar11,&local_7f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               &point_4.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Coxeter_triangulation/test/freud_triang_test.cpp"
               ,0x7a);
    boost::test_tools::tt_detail::report_assertion
              (&local_6e8,&local_7e8,
               &point_4.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,0x31,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_7e8);
    boost::test_tools::assertion_result::~assertion_result(&local_6e8);
    std::
    vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ::~vector((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
               *)(local_710 + 0x10));
    std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::~allocator
              (&local_7c3);
    local_1318 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_710;
    do {
      local_1318 = local_1318 + -1;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(local_1318);
    } while (local_1318 != &local_758);
    std::allocator<unsigned_long>::~allocator(&local_7c1);
    std::allocator<unsigned_long>::~allocator(&local_7a1);
    std::allocator<unsigned_long>::~allocator(&local_781);
    bVar7 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar7);
  Gudhi::coxeter_triangulation::
  Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  ::~Permutahedral_representation
            ((Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
              *)local_600);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_598);
  local_848[2] = 0.3;
  local_848[0] = 3.5;
  local_848[1] = -1.8;
  local_830 = local_848;
  local_828 = 3;
  paVar1 = (allocator<double> *)
           ((long)&s_4.partition_.
                   super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<double>::allocator(paVar1);
  __l_06._M_len = local_828;
  __l_06._M_array = local_830;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_820,__l_06,paVar1);
  std::allocator<double>::~allocator
            ((allocator<double> *)
             ((long)&s_4.partition_.
                     super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  Gudhi::coxeter_triangulation::
  Freudenthal_triangulation<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,std::allocator<int>>,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>>
  ::locate_point<std::vector<double,std::allocator<double>>>
            ((Simplex_handle *)local_880,
             &point_1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (vector<double,_std::allocator<double>_> *)local_820,1.0);
  do {
    uVar4 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_890,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Coxeter_triangulation/test/freud_triang_test.cpp"
               ,0x7a);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_8a0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar4,&local_890,0x37,&local_8a0);
    pVVar10 = Gudhi::coxeter_triangulation::
              Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
              ::vertex((Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                        *)local_880);
    local_8ec[0] = 3;
    local_8ec[1] = 0xfffffffe;
    local_8ec[2] = 0;
    local_8e0 = local_8ec;
    local_8d8 = 3;
    std::allocator<int>::allocator(&local_8ed);
    __l_05._M_len = local_8d8;
    __l_05._M_array = local_8e0;
    std::vector<int,_std::allocator<int>_>::vector(&local_8d0,__l_05,&local_8ed);
    bVar7 = std::operator==(pVVar10,&local_8d0);
    boost::test_tools::assertion_result::assertion_result(&local_8b8,bVar7);
    plVar11 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_920,"s.vertex() == Vertex_handle({3, -2, 0})",0x27);
    boost::unit_test::operator<<(&local_910,plVar11,&local_920);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_930,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Coxeter_triangulation/test/freud_triang_test.cpp"
               ,0x7a);
    boost::test_tools::tt_detail::report_assertion(&local_8b8,&local_910,&local_930,0x37,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_910);
    boost::test_tools::assertion_result::~assertion_result(&local_8b8);
    std::vector<int,_std::allocator<int>_>::~vector(&local_8d0);
    std::allocator<int>::~allocator(&local_8ed);
    bVar7 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar7);
  do {
    uVar4 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_940,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Coxeter_triangulation/test/freud_triang_test.cpp"
               ,0x7a);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_950);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar4,&local_940,0x38,&local_950);
    pOVar12 = Gudhi::coxeter_triangulation::
              Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
              ::partition((Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                           *)local_880);
    local_a72 = 1;
    local_a10 = 0;
    local_a08 = &local_a10;
    local_a00 = 1;
    local_9f8 = &local_9f0;
    std::allocator<unsigned_long>::allocator(&local_a11);
    __l_03._M_len = local_a00;
    __l_03._M_array = local_a08;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_9f0,__l_03,&local_a11)
    ;
    local_a30 = 2;
    local_a28 = &local_a30;
    local_a20 = 1;
    local_9f8 = &local_9d8;
    std::allocator<unsigned_long>::allocator(&local_a31);
    __l_02._M_len = local_a20;
    __l_02._M_array = local_a28;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_9d8,__l_02,&local_a31)
    ;
    local_a50 = 1;
    local_a48 = &local_a50;
    local_a40 = 1;
    local_9f8 = &local_9c0;
    std::allocator<unsigned_long>::allocator(&local_a51);
    __l_01._M_len = local_a40;
    __l_01._M_array = local_a48;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_9c0,__l_01,&local_a51)
    ;
    local_a70 = 3;
    local_a68 = &local_a70;
    local_a60 = 1;
    local_9f8 = &local_9a8;
    std::allocator<unsigned_long>::allocator(&local_a71);
    __l_00._M_len = local_a60;
    __l_00._M_array = local_a68;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_9a8,__l_00,&local_a71)
    ;
    local_a72 = 0;
    local_990._0_8_ = &local_9f0;
    local_990._8_8_ = (pointer)0x4;
    std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::allocator
              (&local_a73);
    __l_04._M_len = local_990._8_8_;
    __l_04._M_array = (iterator)local_990._0_8_;
    std::
    vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ::vector((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
              *)(local_990 + 0x10),__l_04,&local_a73);
    bVar7 = std::operator==(pOVar12,(vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                     *)(local_990 + 0x10));
    boost::test_tools::assertion_result::assertion_result(&local_968,bVar7);
    plVar11 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_aa8,
               "s.partition() == Ordered_set_partition({Part({0}), Part({2}), Part({1}), Part({3})})"
               ,0x54);
    boost::unit_test::operator<<(&local_a98,plVar11,&local_aa8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_ab8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Coxeter_triangulation/test/freud_triang_test.cpp"
               ,0x7a);
    boost::test_tools::tt_detail::report_assertion(&local_968,&local_a98,&local_ab8,0x38,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_a98);
    boost::test_tools::assertion_result::~assertion_result(&local_968);
    std::
    vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ::~vector((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
               *)(local_990 + 0x10));
    std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::~allocator
              (&local_a73);
    local_13d8 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_990;
    do {
      local_13d8 = local_13d8 + -1;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(local_13d8);
    } while (local_13d8 != &local_9f0);
    std::allocator<unsigned_long>::~allocator(&local_a71);
    std::allocator<unsigned_long>::~allocator(&local_a51);
    std::allocator<unsigned_long>::~allocator(&local_a31);
    std::allocator<unsigned_long>::~allocator(&local_a11);
    bVar7 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar7);
  Gudhi::coxeter_triangulation::
  Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  ::~Permutahedral_representation
            ((Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
              *)local_880);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_820);
  do {
    uVar4 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_ac8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Coxeter_triangulation/test/freud_triang_test.cpp"
               ,0x7a);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_ad8);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar4,&local_ac8,0x3c,&local_ad8);
    uVar9 = Gudhi::coxeter_triangulation::
            Freudenthal_triangulation<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
            ::dimension((Freudenthal_triangulation<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                         *)&point_1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage);
    boost::test_tools::assertion_result::assertion_result(&local_af0,uVar9 == 3);
    plVar11 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_b20,"tr.dimension() == 3",0x13);
    boost::unit_test::operator<<(&local_b10,plVar11,&local_b20);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               &default_matrix.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                m_storage.m_cols,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Coxeter_triangulation/test/freud_triang_test.cpp"
               ,0x7a);
    boost::test_tools::tt_detail::report_assertion
              (&local_af0,&local_b10,
               &default_matrix.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                m_storage.m_cols,0x3c,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_b10);
    boost::test_tools::assertion_result::~assertion_result(&local_af0);
    bVar7 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar7);
  Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::Identity(&local_b60,3,3);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((Matrix<double,_1,_1,0,_1,_1> *)local_b48,
             (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)&local_b60);
  do {
    uVar4 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_b70,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Coxeter_triangulation/test/freud_triang_test.cpp"
               ,0x7a);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_b80);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar4,&local_b70,0x3f,&local_b80);
    pMVar13 = (MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)
              Gudhi::coxeter_triangulation::
              Freudenthal_triangulation<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
              ::matrix((Freudenthal_triangulation<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                        *)&point_1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage);
    bVar7 = Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator==
                      (pMVar13,(MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_b48);
    boost::test_tools::assertion_result::assertion_result(&local_b98,bVar7);
    plVar11 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_bc8,"tr.matrix() == default_matrix",0x1d);
    boost::unit_test::operator<<(&local_bb8,plVar11,&local_bc8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               &default_offset.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                m_storage.m_cols,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Coxeter_triangulation/test/freud_triang_test.cpp"
               ,0x7a);
    boost::test_tools::tt_detail::report_assertion
              (&local_b98,&local_bb8,
               &default_offset.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                m_storage.m_cols,0x3f,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_bb8);
    boost::test_tools::assertion_result::~assertion_result(&local_b98);
    bVar7 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar7);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::Zero(&local_c08,3);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
            ((Matrix<double,_1,_1,0,_1,_1> *)local_bf0,
             (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)&local_c08);
  do {
    uVar4 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_c18,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Coxeter_triangulation/test/freud_triang_test.cpp"
               ,0x7a);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_c28);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar4,&local_c18,0x42,&local_c28);
    pMVar14 = (MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)
              Gudhi::coxeter_triangulation::
              Freudenthal_triangulation<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
              ::offset((Freudenthal_triangulation<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                        *)&point_1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage);
    bVar7 = Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator==
                      (pMVar14,(MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_bf0);
    boost::test_tools::assertion_result::assertion_result(&local_c40,bVar7);
    plVar11 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_c70,"tr.offset() == default_offset",0x1d);
    boost::unit_test::operator<<(&local_c60,plVar11,&local_c70);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               &point.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Coxeter_triangulation/test/freud_triang_test.cpp"
               ,0x7a);
    boost::test_tools::tt_detail::report_assertion
              (&local_c40,&local_c60,
               &point.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,0x42,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_c60);
    boost::test_tools::assertion_result::~assertion_result(&local_c40);
    bVar7 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar7);
  local_cc8[0] = 3.5;
  local_cc8[1] = -1.8;
  local_cc8[2] = 0.3;
  local_ca8 = local_cc8;
  local_ca0 = 3;
  paVar1 = (allocator<double> *)
           ((long)&s.partition_.
                   super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<double>::allocator(paVar1);
  __l._M_len = local_ca0;
  __l._M_array = local_ca8;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_c98,__l,paVar1);
  std::allocator<double>::~allocator
            ((allocator<double> *)
             ((long)&s.partition_.
                     super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  Gudhi::coxeter_triangulation::
  Freudenthal_triangulation<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,std::allocator<int>>,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>>
  ::locate_point<std::vector<double,std::allocator<double>>>
            ((Simplex_handle *)
             (barycenter_cart.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
              .m_data.array + 2),
             &point_1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (vector<double,_std::allocator<double>_> *)local_c98,1.0);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::Zero();
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>>>
            (local_d18,
             (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)&__range1);
  Gudhi::coxeter_triangulation::
  Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  ::vertex_range((Vertex_range *)&__begin1.is_end_,
                 (Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                  *)(barycenter_cart.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                     m_storage.m_data.array + 2));
  boost::iterator_range_detail::
  iterator_range_base<Gudhi::coxeter_triangulation::Vertex_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_boost::iterators::incrementable_traversal_tag>
  ::begin((Vertex_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
           *)&__end1.is_end_,
          (iterator_range_base<Gudhi::coxeter_triangulation::Vertex_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_boost::iterators::incrementable_traversal_tag>
           *)&__begin1.is_end_);
  boost::iterator_range_detail::
  iterator_range_base<Gudhi::coxeter_triangulation::Vertex_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_boost::iterators::incrementable_traversal_tag>
  ::end((Vertex_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
         *)&v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage,
        (iterator_range_base<Gudhi::coxeter_triangulation::Vertex_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_boost::iterators::incrementable_traversal_tag>
         *)&__begin1.is_end_);
  while (tVar8 = boost::iterators::operator!=
                           ((iterator_facade<Gudhi::coxeter_triangulation::Vertex_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_const_std::vector<int,_std::allocator<int>_>,_boost::iterators::forward_traversal_tag,_const_std::vector<int,_std::allocator<int>_>_&,_long>
                             *)&__end1.is_end_,
                            (iterator_facade<Gudhi::coxeter_triangulation::Vertex_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_const_std::vector<int,_std::allocator<int>_>,_boost::iterators::forward_traversal_tag,_const_std::vector<int,_std::allocator<int>_>_&,_long>
                             *)&v.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage), tVar8) {
    pvVar18 = boost::iterators::detail::
              iterator_facade_base<Gudhi::coxeter_triangulation::Vertex_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_const_std::vector<int,_std::allocator<int>_>,_boost::iterators::forward_traversal_tag,_const_std::vector<int,_std::allocator<int>_>_&,_long,_false,_false>
              ::operator*((iterator_facade_base<Gudhi::coxeter_triangulation::Vertex_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_const_std::vector<int,_std::allocator<int>_>,_boost::iterators::forward_traversal_tag,_const_std::vector<int,_std::allocator<int>_>_&,_long,_false,_false>
                           *)&__end1.is_end_);
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)&i,pvVar18);
    for (local_e10 = (double *)0x0;
        pdVar15 = (double *)
                  std::vector<int,_std::allocator<int>_>::size
                            ((vector<int,_std::allocator<int>_> *)&i), local_e10 < pdVar15;
        local_e10 = (double *)((long)local_e10 + 1)) {
      pvVar20 = std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)&i,(size_type)local_e10);
      iVar3 = *pvVar20;
      pSVar17 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)local_d18,
                           (Index)local_e10);
      *pSVar17 = (double)iVar3 + *pSVar17;
    }
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&i);
    boost::iterators::detail::
    iterator_facade_base<Gudhi::coxeter_triangulation::Vertex_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_const_std::vector<int,_std::allocator<int>_>,_boost::iterators::forward_traversal_tag,_const_std::vector<int,_std::allocator<int>_>_&,_long,_false,_false>
    ::operator++((iterator_facade_base<Gudhi::coxeter_triangulation::Vertex_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_const_std::vector<int,_std::allocator<int>_>,_boost::iterators::forward_traversal_tag,_const_std::vector<int,_std::allocator<int>_>_&,_long,_false,_false>
                  *)&__end1.is_end_);
  }
  Gudhi::coxeter_triangulation::
  Vertex_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  ::~Vertex_iterator((Vertex_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                      *)&v.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage);
  Gudhi::coxeter_triangulation::
  Vertex_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  ::~Vertex_iterator((Vertex_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                      *)&__end1.is_end_);
  boost::
  iterator_range<Gudhi::coxeter_triangulation::Vertex_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>
  ::~iterator_range((iterator_range<Gudhi::coxeter_triangulation::Vertex_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>
                     *)&__begin1.is_end_);
  barycenter.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
       = 4.0;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator/=
            ((DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_d18,
             barycenter.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
             m_data.array + 2);
  Gudhi::coxeter_triangulation::
  Freudenthal_triangulation<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  ::barycenter((Freudenthal_triangulation<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                *)&i_1,(Simplex_handle *)
                       &point_1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,1.0);
  Eigen::Matrix<double,3,1,0,3,1>::Matrix<Eigen::Matrix<double,_1,1,0,_1,1>>
            (local_e30,(EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&i_1);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)&i_1);
  for (local_e48 = 0; lVar6 = local_e48,
      IVar16 = Eigen::EigenBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::size
                         ((EigenBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_e30),
      lVar6 < IVar16; local_e48 = local_e48 + 1) {
    pSVar17 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)local_e30,
                         local_e48);
    dVar2 = *pSVar17;
    pSVar17 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)local_d18,
                         local_e48);
    GUDHI_TEST_FLOAT_EQUALITY_CHECK<double>(dVar2,*pSVar17,1e-07);
  }
  Gudhi::coxeter_triangulation::
  Freudenthal_triangulation<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,std::allocator<int>>,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>>
  ::locate_point<std::vector<double,std::allocator<double>>>
            (&local_e78,
             &point_1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (vector<double,_std::allocator<double>_> *)local_c98,2.0);
  Gudhi::coxeter_triangulation::
  Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  ::operator=((Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
               *)(barycenter_cart.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                  m_storage.m_data.array + 2),&local_e78);
  Gudhi::coxeter_triangulation::
  Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  ::~Permutahedral_representation(&local_e78);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::Zero();
  Eigen::Matrix<double,3,1,0,3,1>::operator=
            (local_d18,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)&__range1_1);
  Gudhi::coxeter_triangulation::
  Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  ::vertex_range((Vertex_range *)&__begin1_1.is_end_,
                 (Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                  *)(barycenter_cart.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                     m_storage.m_data.array + 2));
  boost::iterator_range_detail::
  iterator_range_base<Gudhi::coxeter_triangulation::Vertex_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_boost::iterators::incrementable_traversal_tag>
  ::begin((Vertex_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
           *)&__end1_1.is_end_,
          (iterator_range_base<Gudhi::coxeter_triangulation::Vertex_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_boost::iterators::incrementable_traversal_tag>
           *)&__begin1_1.is_end_);
  boost::iterator_range_detail::
  iterator_range_base<Gudhi::coxeter_triangulation::Vertex_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_boost::iterators::incrementable_traversal_tag>
  ::end((Vertex_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
         *)&v_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage,
        (iterator_range_base<Gudhi::coxeter_triangulation::Vertex_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_boost::iterators::incrementable_traversal_tag>
         *)&__begin1_1.is_end_);
  while (tVar8 = boost::iterators::operator!=
                           ((iterator_facade<Gudhi::coxeter_triangulation::Vertex_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_const_std::vector<int,_std::allocator<int>_>,_boost::iterators::forward_traversal_tag,_const_std::vector<int,_std::allocator<int>_>_&,_long>
                             *)&__end1_1.is_end_,
                            (iterator_facade<Gudhi::coxeter_triangulation::Vertex_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_const_std::vector<int,_std::allocator<int>_>,_boost::iterators::forward_traversal_tag,_const_std::vector<int,_std::allocator<int>_>_&,_long>
                             *)&v_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage), tVar8) {
    pvVar18 = boost::iterators::detail::
              iterator_facade_base<Gudhi::coxeter_triangulation::Vertex_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_const_std::vector<int,_std::allocator<int>_>,_boost::iterators::forward_traversal_tag,_const_std::vector<int,_std::allocator<int>_>_&,_long,_false,_false>
              ::operator*((iterator_facade_base<Gudhi::coxeter_triangulation::Vertex_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_const_std::vector<int,_std::allocator<int>_>,_boost::iterators::forward_traversal_tag,_const_std::vector<int,_std::allocator<int>_>_&,_long,_false,_false>
                           *)&__end1_1.is_end_);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)&i_2,pvVar18);
    for (local_f70 = (double *)0x0; pdVar15 = local_f70,
        pdVar19 = (double *)
                  std::vector<int,_std::allocator<int>_>::size
                            ((vector<int,_std::allocator<int>_> *)&i_2), pdVar15 < pdVar19;
        local_f70 = (double *)((long)local_f70 + 1)) {
      pvVar20 = std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)&i_2,(size_type)local_f70);
      iVar3 = *pvVar20;
      pSVar17 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)local_d18,
                           (Index)local_f70);
      *pSVar17 = (double)iVar3 + *pSVar17;
    }
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&i_2);
    boost::iterators::detail::
    iterator_facade_base<Gudhi::coxeter_triangulation::Vertex_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_const_std::vector<int,_std::allocator<int>_>,_boost::iterators::forward_traversal_tag,_const_std::vector<int,_std::allocator<int>_>_&,_long,_false,_false>
    ::operator++((iterator_facade_base<Gudhi::coxeter_triangulation::Vertex_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_const_std::vector<int,_std::allocator<int>_>,_boost::iterators::forward_traversal_tag,_const_std::vector<int,_std::allocator<int>_>_&,_long,_false,_false>
                  *)&__end1_1.is_end_);
  }
  Gudhi::coxeter_triangulation::
  Vertex_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  ::~Vertex_iterator((Vertex_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                      *)&v_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage);
  Gudhi::coxeter_triangulation::
  Vertex_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  ::~Vertex_iterator((Vertex_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                      *)&__end1_1.is_end_);
  boost::
  iterator_range<Gudhi::coxeter_triangulation::Vertex_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>
  ::~iterator_range((iterator_range<Gudhi::coxeter_triangulation::Vertex_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>
                     *)&__begin1_1.is_end_);
  local_f78 = 3.0;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator/=
            ((DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_d18,&local_f78);
  local_f80 = 2.0;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator/=
            ((DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_d18,&local_f80);
  Gudhi::coxeter_triangulation::
  Freudenthal_triangulation<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  ::barycenter((Freudenthal_triangulation<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                *)&i_3,(Simplex_handle *)
                       &point_1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,2.0);
  Eigen::Matrix<double,3,1,0,3,1>::operator=
            (local_e30,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&i_3);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)&i_3);
  for (new_matrix.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols
            = 0;
      IVar5 = new_matrix.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_cols,
      IVar16 = Eigen::EigenBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::size
                         ((EigenBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_e30),
      IVar5 < IVar16;
      new_matrix.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
           new_matrix.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_cols + 1) {
    pSVar17 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)local_e30,
                         new_matrix.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                         .m_storage.m_cols);
    dVar2 = *pSVar17;
    pSVar17 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)local_d18,
                         new_matrix.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                         .m_storage.m_cols);
    GUDHI_TEST_FLOAT_EQUALITY_CHECK<double>(dVar2,*pSVar17,1e-07);
  }
  local_fb8[1] = 3;
  local_fb8[0] = 3;
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,int>
            ((Matrix<double,_1,_1,0,_1,_1> *)local_fb0,local_fb8 + 1,local_fb8);
  local_fe0 = 1.0;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator<<
            (&local_fd8,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_fb0,&local_fe0
            );
  local_fe8 = 0.0;
  pCVar21 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                      (&local_fd8,&local_fe8);
  local_ff0 = 0.0;
  pCVar21 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                      (pCVar21,&local_ff0);
  local_ff8 = -1.0;
  pCVar21 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                      (pCVar21,&local_ff8);
  local_1000 = 1.0;
  pCVar21 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                      (pCVar21,&local_1000);
  local_1008 = 0.0;
  pCVar21 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                      (pCVar21,&local_1008);
  local_1010 = -1.0;
  pCVar21 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                      (pCVar21,&local_1010);
  local_1018 = 0.0;
  pCVar21 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                      (pCVar21,&local_1018);
  new_offset.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
       = 1.0;
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
            (pCVar21,new_offset.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                     m_storage.m_data.array + 2);
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::~CommaInitializer(&local_fd8);
  local_1040 = 1.5;
  local_1048 = 1.0;
  local_1050 = 0.5;
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
            ((Matrix<double,_3,_1,_0,_3,_1> *)local_1038,&local_1040,&local_1048,&local_1050);
  Gudhi::coxeter_triangulation::
  Freudenthal_triangulation<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  ::change_matrix((Freudenthal_triangulation<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                   *)&point_1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,(MatrixXd *)local_fb0);
  Eigen::Matrix<double,-1,1,0,-1,1>::Matrix<Eigen::Matrix<double,3,1,0,3,1>>
            ((Matrix<double,_1,1,0,_1,1> *)&local_1060,
             (EigenBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_1038);
  Gudhi::coxeter_triangulation::
  Freudenthal_triangulation<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  ::change_offset((Freudenthal_triangulation<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                   *)&point_1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,&local_1060);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix(&local_1060);
  do {
    uVar4 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1070,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Coxeter_triangulation/test/freud_triang_test.cpp"
               ,0x7a);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_1080);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar4,&local_1070,0x61,&local_1080);
    pMVar13 = (MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)
              Gudhi::coxeter_triangulation::
              Freudenthal_triangulation<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
              ::matrix((Freudenthal_triangulation<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                        *)&point_1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage);
    bVar7 = Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator==
                      (pMVar13,(MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_fb0);
    boost::test_tools::assertion_result::assertion_result(&local_1098,bVar7);
    plVar11 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_10c8,"tr.matrix() == new_matrix",0x19);
    boost::unit_test::operator<<(&local_10b8,plVar11,&local_10c8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_10d8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Coxeter_triangulation/test/freud_triang_test.cpp"
               ,0x7a);
    boost::test_tools::tt_detail::report_assertion(&local_1098,&local_10b8,&local_10d8,0x61,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_10b8);
    boost::test_tools::assertion_result::~assertion_result(&local_1098);
    bVar7 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar7);
  do {
    uVar4 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_10e8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Coxeter_triangulation/test/freud_triang_test.cpp"
               ,0x7a);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_10f8);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar4,&local_10e8,0x62,&local_10f8);
    pMVar14 = (MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)
              Gudhi::coxeter_triangulation::
              Freudenthal_triangulation<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
              ::offset((Freudenthal_triangulation<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                        *)&point_1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage);
    bVar7 = Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator==
                      (pMVar14,(MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_1038);
    boost::test_tools::assertion_result::assertion_result(&local_1110,bVar7);
    plVar11 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1140,"tr.offset() == new_offset",0x19);
    boost::unit_test::operator<<(&local_1130,plVar11,&local_1140);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1150,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Coxeter_triangulation/test/freud_triang_test.cpp"
               ,0x7a);
    boost::test_tools::tt_detail::report_assertion(&local_1110,&local_1130,&local_1150,0x62,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_1130);
    boost::test_tools::assertion_result::~assertion_result(&local_1110);
    bVar7 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar7);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)local_fb0);
  Gudhi::coxeter_triangulation::
  Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  ::~Permutahedral_representation
            ((Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
              *)(barycenter_cart.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                 m_storage.m_data.array + 2));
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_c98);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)local_bf0);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)local_b48);
  Gudhi::coxeter_triangulation::
  Freudenthal_triangulation<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  ::~Freudenthal_triangulation
            ((Freudenthal_triangulation<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
              *)&point_1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(freudenthal_triangulation) {
  // Point location check
  typedef std::vector<double> Point;
  typedef Gudhi::coxeter_triangulation::Freudenthal_triangulation<> FK_triangulation;
  typedef typename FK_triangulation::Simplex_handle Simplex_handle;
  typedef typename FK_triangulation::Vertex_handle Vertex_handle;
  typedef typename Simplex_handle::OrderedSetPartition Ordered_set_partition;
  typedef typename Ordered_set_partition::value_type Part;

  FK_triangulation tr(3);

  // Point location check
  {
    Point point({3, -1, 0});
    Simplex_handle s = tr.locate_point(point);
    BOOST_CHECK(s.vertex() == Vertex_handle({3, -1, 0}));
    BOOST_CHECK(s.partition() == Ordered_set_partition({Part({0, 1, 2, 3})}));
  }

  {
    Point point({3.5, -1.5, 0.5});
    Simplex_handle s = tr.locate_point(point);
    BOOST_CHECK(s.vertex() == Vertex_handle({3, -2, 0}));
    BOOST_CHECK(s.partition() == Ordered_set_partition({Part({0, 1, 2}), Part({3})}));
  }

  {
    Point point({3.5, -1.8, 0.5});
    Simplex_handle s = tr.locate_point(point);
    BOOST_CHECK(s.vertex() == Vertex_handle({3, -2, 0}));
    BOOST_CHECK(s.partition() == Ordered_set_partition({Part({0, 2}), Part({1}), Part({3})}));
  }

  {
    Point point({3.5, -1.8, 0.3});
    Simplex_handle s = tr.locate_point(point);
    BOOST_CHECK(s.vertex() == Vertex_handle({3, -2, 0}));
    BOOST_CHECK(s.partition() == Ordered_set_partition({Part({0}), Part({2}), Part({1}), Part({3})}));
  }

  // Dimension check
  BOOST_CHECK(tr.dimension() == 3);
  // Matrix check
  Eigen::MatrixXd default_matrix = Eigen::MatrixXd::Identity(3, 3);
  BOOST_CHECK(tr.matrix() == default_matrix);
  // Vector check
  Eigen::MatrixXd default_offset = Eigen::VectorXd::Zero(3);
  BOOST_CHECK(tr.offset() == default_offset);

  // Barycenter check
  Point point({3.5, -1.8, 0.3});
  Simplex_handle s = tr.locate_point(point);
  Eigen::Vector3d barycenter_cart = Eigen::Vector3d::Zero();
  for (auto v : s.vertex_range())
    for (std::size_t i = 0; i < v.size(); i++) barycenter_cart(i) += v[i];
  barycenter_cart /= 4.;  // simplex is three-dimensional
  Eigen::Vector3d barycenter = tr.barycenter(s);
  for (std::size_t i = 0; (long int)i < barycenter.size(); i++)
    GUDHI_TEST_FLOAT_EQUALITY_CHECK(barycenter(i), barycenter_cart(i), 1e-7);

  // Barycenter check for twice the scale
  s = tr.locate_point(point, 2);
  barycenter_cart = Eigen::Vector3d::Zero();
  for (auto v : s.vertex_range())
    for (std::size_t i = 0; i < v.size(); i++) barycenter_cart(i) += v[i];
  barycenter_cart /= 3.;  // simplex is now a two-dimensional face
  barycenter_cart /= 2.;  // scale
  barycenter = tr.barycenter(s, 2);
  for (std::size_t i = 0; (long int)i < barycenter.size(); i++)
    GUDHI_TEST_FLOAT_EQUALITY_CHECK(barycenter(i), barycenter_cart(i), 1e-7);

  // Matrix and offset change check
  Eigen::MatrixXd new_matrix(3, 3);
  new_matrix << 1, 0, 0, -1, 1, 0, -1, 0, 1;
  Eigen::Vector3d new_offset(1.5, 1, 0.5);
  tr.change_matrix(new_matrix);
  tr.change_offset(new_offset);

  BOOST_CHECK(tr.matrix() == new_matrix);
  BOOST_CHECK(tr.offset() == new_offset);
}